

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall
rengine::Signal<>::disconnect(Signal<> *this,SignalEmitter *emitter,SignalHandler<> *handler)

{
  bool bVar1;
  vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_> *this_00;
  const_iterator local_50;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  local_48;
  SignalHandler<> **local_40;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  local_38;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  local_30;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  pos;
  Bucket *bucket;
  SignalHandler<> *handler_local;
  SignalEmitter *emitter_local;
  Signal<> *this_local;
  
  bucket = (Bucket *)handler;
  handler_local = (SignalHandler<> *)emitter;
  emitter_local = (SignalEmitter *)this;
  pos._M_current = (SignalHandler<> **)findBucket(this,emitter);
  if ((Bucket *)pos._M_current == (Bucket *)0x0) {
    __assert_fail("bucket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                  ,0x74,
                  "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
                 );
  }
  local_38._M_current =
       (SignalHandler<> **)
       std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::begin
                 (&((Bucket *)pos._M_current)->handlers);
  local_40 = (SignalHandler<> **)
             std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::
             end((vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_> *)
                 (pos._M_current + 2));
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<rengine::SignalHandler<>**,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>,rengine::SignalHandler<>*>
                       (local_38,(__normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
                                  )local_40,(SignalHandler<> **)&bucket);
  local_48._M_current =
       (SignalHandler<> **)
       std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::end
                 ((vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_> *
                  )(pos._M_current + 2));
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
  if (!bVar1) {
    __assert_fail("pos != bucket->handlers.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                  ,0x76,
                  "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
                 );
  }
  this_00 = (vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_> *)
            (pos._M_current + 2);
  __gnu_cxx::
  __normal_iterator<rengine::SignalHandler<>*const*,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>
  ::__normal_iterator<rengine::SignalHandler<>**>
            ((__normal_iterator<rengine::SignalHandler<>*const*,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>
              *)&local_50,&local_30);
  std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::erase
            (this_00,local_50);
  return;
}

Assistant:

void disconnect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        assert(bucket);
        auto pos = std::find(bucket->handlers.begin(), bucket->handlers.end(), handler);
        assert(pos != bucket->handlers.end());
        bucket->handlers.erase(pos);
    }